

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

void __thiscall expression::expression(expression *this)

{
  expression *this_local;
  
  this->FLAGS = 0;
  this->uuid = 0;
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset(&this->contents)
  ;
  return;
}

Assistant:

expression::expression() {}